

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
duckdb_fmt::v6::
format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
::on_format_specs(format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                  *this,char *begin,char *end)

{
  size_t *psVar1;
  basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler> *pbVar2;
  basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
  *pbVar3;
  char *pcVar4;
  char *pcVar5;
  iterator iVar6;
  undefined8 uVar7;
  basic_format_specs<char> specs;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [20];
  basic_format_specs<char> local_94;
  arg_formatter<duckdb_fmt::v6::buffer_range<char>_> local_80;
  specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
  local_58;
  
  pcVar5 = (this->parse_context).format_str_.data_;
  (this->parse_context).format_str_.data_ = begin;
  psVar1 = &(this->parse_context).format_str_.size_;
  *psVar1 = (size_t)(pcVar5 + (*psVar1 - (long)begin));
  pbVar2 = &this->parse_context;
  pbVar3 = &this->context;
  if ((this->arg).type_ == custom_type) {
    (*(this->arg).value_.field_0.custom.format)
              ((void *)(this->arg).value_.field_0.long_long_value,pbVar2,pbVar3);
    pcVar5 = (this->parse_context).format_str_.data_;
  }
  else {
    local_94.width = 0;
    local_94.precision = -1;
    local_94.type = '\0';
    local_94._9_1_ = 0;
    local_94.fill.data_[4] = '\0';
    local_94.fill.data_[5] = '\0';
    local_94.fill.data_[0] = ' ';
    local_94.fill.data_[1] = '\0';
    local_94.fill.data_[2] = '\0';
    local_94.fill.data_[3] = '\0';
    local_94.thousands = '\0';
    local_58.checker_.arg_type_ = (this->arg).type_;
    local_58.checker_.error_handler_ =
         &local_58.
          super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    ;
    local_58.
    super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    .super_specs_setter<char>.specs_ = &local_94;
    local_58.
    super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    .parse_context_ = pbVar2;
    local_58.
    super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    .context_ = pbVar3;
    pcVar5 = internal::
             parse_format_specs<char,duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&>
                       (begin,end,
                        (specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
                         *)local_58.checker_.error_handler_);
    if ((pcVar5 == end) || (*pcVar5 != '}')) {
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"missing \'}\' in format string","");
      uVar7 = duckdb_fmt::v6::internal::error_handler::on_error(this,local_b8);
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0]);
      }
      _Unwind_Resume(uVar7);
    }
    pcVar4 = (this->parse_context).format_str_.data_;
    (this->parse_context).format_str_.data_ = pcVar5;
    psVar1 = &(this->parse_context).format_str_.size_;
    *psVar1 = (size_t)(pcVar4 + (*psVar1 - (long)pcVar5));
    local_80.
    super_arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
    .writer_.out_.container = (this->context).out_.container;
    local_80.
    super_arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
    .writer_.locale_.locale_ = (this->context).loc_.locale_;
    local_80.
    super_arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
    .specs_ = &local_94;
    local_80.ctx_ = pbVar3;
    local_80.parse_ctx_ = pbVar2;
    iVar6 = visit_format_arg<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                      (&local_80,&this->arg);
    (this->context).out_.container = iVar6.container;
  }
  return pcVar5;
}

Assistant:

const Char* on_format_specs(const Char* begin, const Char* end) {
    advance_to(parse_context, begin);
    internal::custom_formatter<Context> f(parse_context, context);
    if (visit_format_arg(f, arg)) return parse_context.begin();
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    using parse_context_t = basic_format_parse_context<Char>;
    internal::specs_checker<specs_handler<parse_context_t, Context>> handler(
        specs_handler<parse_context_t, Context>(specs, parse_context, context),
        arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}') on_error("missing '}' in format string");
    advance_to(parse_context, begin);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context, &specs), arg));
    return begin;
  }